

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<char*,char>>::char_writer>
          (basic_writer<fmt::v5::output_range<char*,char>> *this,align_spec *spec,char_writer *f)

{
  byte bVar1;
  char_type cVar2;
  char_type *__s;
  char __tmp;
  char_type *pcVar3;
  void *pvVar4;
  size_t __len_1;
  ulong uVar5;
  size_t __len;
  ulong __n;
  
  uVar5 = (ulong)spec->width_;
  if (uVar5 < 2) {
    cVar2 = f->value;
    pcVar3 = *(char_type **)this;
    *(char_type **)this = pcVar3 + 1;
    *pcVar3 = cVar2;
  }
  else {
    bVar1 = (byte)spec->fill_;
    __n = uVar5 - 1;
    if (spec->align_ == ALIGN_CENTER) {
      uVar5 = __n >> 1;
      __s = *(char_type **)this;
      pcVar3 = __s;
      if (spec->width_ != 2) {
        pcVar3 = __s + uVar5;
        memset(__s,(uint)bVar1,uVar5);
      }
      cVar2 = f->value;
      *(char_type **)this = pcVar3 + 1;
      *pcVar3 = cVar2;
      pvVar4 = *(void **)this;
      __n = __n - uVar5;
    }
    else {
      if (spec->align_ == ALIGN_RIGHT) {
        pvVar4 = *(void **)this;
        memset(pvVar4,(uint)bVar1,__n);
        cVar2 = f->value;
        *(ulong *)this = (long)pvVar4 + uVar5;
        *(char_type *)((long)pvVar4 + (uVar5 - 1)) = cVar2;
        return;
      }
      cVar2 = f->value;
      pcVar3 = *(char_type **)this;
      *(char_type **)this = pcVar3 + 1;
      *pcVar3 = cVar2;
      pvVar4 = *(void **)this;
    }
    memset(pvVar4,(uint)bVar1,__n);
    *(ulong *)this = (long)pvVar4 + __n;
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }